

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
 __thiscall
andres::
RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
::insert(RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
         *this,value_type *value)

{
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  pVar2;
  key_type local_28;
  
  local_28.vertex_ = value->vertex_;
  local_28.edge_ = value->edge_;
  __position._M_current = (Adjacency<unsigned_long> *)lower_bound(this,&local_28);
  if (((__position._M_current ==
        (this->vector_).
        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (value->vertex_ < (__position._M_current)->vertex_)) ||
     ((value->vertex_ == (__position._M_current)->vertex_ &&
      (value->edge_ < (__position._M_current)->edge_)))) {
    local_28.vertex_ = value->vertex_;
    local_28.edge_ = value->edge_;
    __position._M_current =
         (Adjacency<unsigned_long> *)
         std::
         vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
         ::_M_insert_rval(&this->vector_,(const_iterator)__position._M_current,&local_28);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_current = __position._M_current;
  return pVar2;
}

Assistant:

inline std::pair<typename RandomAccessSet<Key, Comparison, Allocator>::const_iterator, bool>
RandomAccessSet<Key, Comparison, Allocator>::insert(
    const typename RandomAccessSet<Key, Comparison, Allocator>::value_type& value
) {
    bool found(true);
    iterator i(lower_bound(static_cast<Key>(value)));
    if(i == end() || compare_(static_cast<Key>(value), *i)) {
        i = vector_.insert(i, static_cast<Key>(value));
        found = false;
    }
    return std::make_pair(i, !found);
}